

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3ClearCursor(Fts3Cursor *pCsr)

{
  sqlite3_vtab *psVar1;
  sqlite3_stmt *pStmt;
  Fts3DeferredToken *pFVar2;
  MatchinfoBuffer *p;
  Fts3DeferredToken *p_00;
  
  if (pCsr->bSeekStmt != '\0') {
    psVar1 = (pCsr->base).pVtab;
    if (psVar1[0x11].zErrMsg == (char *)0x0) {
      pStmt = pCsr->pStmt;
      psVar1[0x11].zErrMsg = (char *)pStmt;
      sqlite3_reset(pStmt);
      pCsr->pStmt = (sqlite3_stmt *)0x0;
    }
    pCsr->bSeekStmt = '\0';
  }
  sqlite3_finalize(pCsr->pStmt);
  p_00 = pCsr->pDeferred;
  while (p_00 != (Fts3DeferredToken *)0x0) {
    pFVar2 = p_00->pNext;
    sqlite3_free(p_00->pList);
    sqlite3_free(p_00);
    p_00 = pFVar2;
  }
  pCsr->pDeferred = (Fts3DeferredToken *)0x0;
  sqlite3_free(pCsr->aDoclist);
  p = pCsr->pMIBuffer;
  if (((p != (MatchinfoBuffer *)0x0) && (p->aRef[0] = '\0', p->aRef[1] == '\0')) &&
     (p->aRef[2] == '\0')) {
    sqlite3_free(p);
  }
  sqlite3Fts3ExprFree(pCsr->pExpr);
  pCsr->iMaxDocid = 0;
  *(undefined8 *)&pCsr->isMatchinfoNeeded = 0;
  pCsr->nDoc = 0;
  pCsr->iMinDocid = 0;
  pCsr->nDoclist = 0;
  pCsr->bDesc = '\0';
  *(undefined3 *)&pCsr->field_0x4d = 0;
  pCsr->eEvalmode = 0;
  pCsr->nRowAvg = 0;
  pCsr->pNextId = (char *)0x0;
  pCsr->aDoclist = (char *)0x0;
  pCsr->pDeferred = (Fts3DeferredToken *)0x0;
  pCsr->iPrevId = 0;
  pCsr->pExpr = (Fts3Expr *)0x0;
  pCsr->iLangid = 0;
  pCsr->nPhrase = 0;
  pCsr->eSearch = 0;
  pCsr->isEof = '\0';
  pCsr->isRequireSeek = '\0';
  pCsr->bSeekStmt = '\0';
  *(undefined3 *)&pCsr->field_0xd = 0;
  pCsr->pStmt = (sqlite3_stmt *)0x0;
  pCsr->pMIBuffer = (MatchinfoBuffer *)0x0;
  return;
}

Assistant:

static void fts3ClearCursor(Fts3Cursor *pCsr){
  fts3CursorFinalizeStmt(pCsr);
  sqlite3Fts3FreeDeferredTokens(pCsr);
  sqlite3_free(pCsr->aDoclist);
  sqlite3Fts3MIBufferFree(pCsr->pMIBuffer);
  sqlite3Fts3ExprFree(pCsr->pExpr);
  memset(&(&pCsr->base)[1], 0, sizeof(Fts3Cursor)-sizeof(sqlite3_vtab_cursor));
}